

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,int c)

{
  String *pSVar1;
  String local_28;
  int local_14;
  String *pSStack_10;
  int c_local;
  String *this_local;
  
  local_14 = c;
  pSStack_10 = this;
  Print((char *)&local_28,"%d",(ulong)(uint)c);
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const int c)
    {
#ifndef HasFloatParsing
        char buffer[12] = { c < 0 ? '-': '\0' };
        utoa((unsigned long)(c < 0 ? -c : c), &buffer[c < 0 ? 1 : 0], 10);
        return *this += buffer;
#else
        return *this += String::Print("%d", c);
#endif
    }